

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O2

MomentData * __thiscall
OpenMD::LDForceModifier::getMomentData(LDForceModifier *this,StuntDouble *sd)

{
  Mat3x3d *this_00;
  double *pdVar1;
  iterator iVar2;
  MomentData *this_01;
  iterator iVar3;
  long lVar4;
  RectMatrix<double,_3U,_3U> local_1a8;
  RealType local_160;
  double local_158;
  RectMatrix<double,_3U,_3U> local_150;
  RectMatrix<double,_3U,_3U> local_108;
  RectMatrix<double,_3U,_3U> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  
  (*sd->_vptr_StuntDouble[7])(&local_1a8);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
          ::find(&(this->momentsMap_)._M_t,(key_type *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->momentsMap_)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (MomentData *)operator_new(0xa8);
    MomentData::MomentData(this_01);
    (*sd->_vptr_StuntDouble[7])(&local_1a8,sd);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
            ::find(&(this->hydroPropMap_)._M_t,(key_type *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header) {
      (*sd->_vptr_StuntDouble[7])(&local_1a8,sd);
      snprintf(painCave.errMsg,2000,
               "LDForceManager createMomentData: Couldn\'t find HydroProp for\nobject type %s!\n",
               local_1a8.data_[0][0]);
      std::__cxx11::string::~string((string *)&local_1a8);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      Vector<double,_3U>::Vector
                ((Vector<double,_3U> *)&local_1a8,
                 (Vector<double,_3U> *)(*(long *)(iVar3._M_node + 2) + 0x20));
      Vector<double,_3U>::operator=((Vector<double,_3U> *)this_01,(Vector<double,_3U> *)&local_1a8);
    }
    if (sd->objType_ == otRigidBody) {
      lVar4 = __dynamic_cast(sd,&StuntDouble::typeinfo,&RigidBody::typeinfo,0);
      Vector<double,_3U>::Vector
                ((Vector<double,_3U> *)&local_1a8,(Vector<double,_3U> *)(lVar4 + 0x140));
      Vector<double,_3U>::sub((Vector<double,_3U> *)this_01,(Vector<double,_3U> *)&local_1a8);
    }
    local_160 = sd->mass_;
    (*sd->_vptr_StuntDouble[5])(&local_1a8,sd);
    this_00 = &this_01->Icr;
    RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)this_00,&local_1a8);
    local_158 = dot<double,3u>((Vector<double,_3U> *)this_01,(Vector<double,_3U> *)this_01);
    SquareMatrix<double,_3>::identity();
    operator*(&local_c0,local_158,&local_78);
    outProduct<double>((SquareMatrix3<double> *)&local_108,(Vector3<double> *)this_01,
                       (Vector3<double> *)this_01);
    OpenMD::operator+(&local_150,&local_c0,&local_108);
    operator*(&local_1a8,local_160,&local_150);
    RectMatrix<double,_3U,_3U>::add((RectMatrix<double,_3U,_3U> *)this_00,&local_1a8);
    SquareMatrix3<double>::inverse((SquareMatrix3<double> *)&local_1a8,this_00);
    RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&this_01->IcrInv,&local_1a8)
    ;
    (*sd->_vptr_StuntDouble[7])(&local_150,sd);
    local_1a8.data_[0][1] = local_150.data_[0][1];
    local_1a8.data_[0][0] = (double)(local_1a8.data_[0] + 2);
    pdVar1 = local_150.data_[0] + 2;
    if ((double *)local_150.data_[0][0] == pdVar1) {
      local_1a8.data_[1][0] = local_150.data_[1][0];
    }
    else {
      local_1a8.data_[0][0] = local_150.data_[0][0];
    }
    local_150.data_[0][1] = 0.0;
    local_150.data_[0][2]._0_1_ = 0;
    local_1a8.data_[1][1] = (double)this_01;
    local_150.data_[0][0] = (double)pdVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::MomentData*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::MomentData*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MomentData*>>>
                *)&this->momentsMap_,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>
                *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_150);
  }
  else {
    this_01 = *(MomentData **)(iVar2._M_node + 2);
  }
  return this_01;
}

Assistant:

MomentData* LDForceModifier::getMomentData(StuntDouble* sd) {
    map<string, MomentData*>::iterator j = momentsMap_.find(sd->getType());
    if (j != momentsMap_.end()) {
      return j->second;
    } else {
      MomentData* moment                  = new MomentData;
      map<string, HydroProp*>::iterator i = hydroPropMap_.find(sd->getType());

      if (i != hydroPropMap_.end()) {
        // Center of Resistance:
        moment->rcr = i->second->getCenterOfResistance();
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LDForceManager createMomentData: Couldn't find HydroProp for\n"
            "object type %s!\n",
            sd->getType().c_str());
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      }

      if (sd->isRigidBody())
        moment->rcr -= dynamic_cast<RigidBody*>(sd)->getRefCOM();

      // Parallel axis formula to get the moment of inertia around
      // the center of resistance:
      RealType mass = sd->getMass();
      moment->Icr   = sd->getI();
      moment->Icr +=
          mass * (dot(moment->rcr, moment->rcr) * Mat3x3d::identity() +
                  outProduct(moment->rcr, moment->rcr));
      moment->IcrInv = moment->Icr.inverse();

      momentsMap_.insert(
          map<string, MomentData*>::value_type(sd->getType(), moment));
      return moment;
    }
  }